

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::CondVar::Remove(CondVar *this,PerThreadSynch *s)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  PerThreadSynch *pPVar4;
  ulong in_RDX;
  ulong extraout_RDX;
  PerThreadSynch *pPVar5;
  PerThreadSynch *pPVar6;
  synchronization_internal *this_00;
  
  this_00 = (synchronization_internal *)0x0;
  do {
    uVar2 = *(ulong *)this;
    if ((uVar2 & 1) == 0) {
      in_RDX = uVar2 | 1;
      LOCK();
      uVar1 = *(ulong *)this;
      if (uVar2 == uVar1) {
        *(ulong *)this = in_RDX;
      }
      UNLOCK();
      if (uVar2 == uVar1) break;
    }
    uVar3 = synchronization_internal::MutexDelay(this_00,1,(int)in_RDX);
    this_00 = (synchronization_internal *)(ulong)uVar3;
    in_RDX = extraout_RDX;
  } while( true );
  pPVar4 = (PerThreadSynch *)(uVar2 & 0xfffffffffffffffc);
  pPVar6 = pPVar4;
  if (pPVar4 == (PerThreadSynch *)0x0) {
    pPVar4 = (PerThreadSynch *)0x0;
  }
  else {
    do {
      pPVar5 = pPVar6;
      pPVar6 = pPVar5->next;
      if (pPVar6 == s) break;
    } while (pPVar6 != pPVar4);
    if (pPVar6 == s) {
      pPVar5->next = s->next;
      pPVar6 = (PerThreadSynch *)0x0;
      if (pPVar5 != s) {
        pPVar6 = pPVar5;
      }
      if (pPVar4 == s) {
        pPVar4 = pPVar6;
      }
      s->next = (PerThreadSynch *)0x0;
      (s->state)._M_i = kAvailable;
    }
  }
  *(ulong *)this = (ulong)((uint)uVar2 & 2) | (ulong)pPVar4;
  return;
}

Assistant:

void CondVar::Remove(PerThreadSynch* s) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed);;
       v = cv_.load(std::memory_order_relaxed)) {
    if ((v & kCvSpin) == 0 &&  // attempt to acquire spinlock
        cv_.compare_exchange_strong(v, v | kCvSpin, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      if (h != nullptr) {
        PerThreadSynch* w = h;
        while (w->next != s && w->next != h) {  // search for thread
          w = w->next;
        }
        if (w->next == s) {  // found thread; remove it
          w->next = s->next;
          if (h == s) {
            h = (w == s) ? nullptr : w;
          }
          s->next = nullptr;
          s->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
        }
      }
      // release spinlock
      cv_.store((v & kCvEvent) | reinterpret_cast<intptr_t>(h),
                std::memory_order_release);
      return;
    } else {
      // try again after a delay
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
}